

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O1

void __thiscall QtMWidgets::PageControl::setCount(PageControl *this,int c)

{
  PageControlPrivate *pPVar1;
  int iVar2;
  QRect local_28;
  
  if ((-1 < c) && (pPVar1 = (this->d).d, pPVar1->count != c)) {
    pPVar1->count = c;
    PageControlPrivate::updateButtonsInfo
              (pPVar1,(*(int *)(*(long *)&this->field_0x20 + 0x1c) -
                      *(int *)(*(long *)&this->field_0x20 + 0x14)) + 1);
    QList<QRect>::clear(&((this->d).d)->rectangles);
    pPVar1 = (this->d).d;
    if ((long)pPVar1->count < 1) {
      iVar2 = pPVar1->currentIndex;
      pPVar1->currentIndex = -1;
      currentChanged(this,-1,iVar2);
      return;
    }
    QList<QRect>::reserve(&pPVar1->rectangles,(long)pPVar1->count);
    pPVar1 = (this->d).d;
    local_28.x1 = 0;
    local_28.y1 = 0;
    local_28.x2 = -1;
    local_28.y2 = -1;
    QList<QRect>::fill(&pPVar1->rectangles,&local_28,(long)pPVar1->count);
    pPVar1 = (this->d).d;
    if (0 < pPVar1->linesCount) {
      iVar2 = 0;
      do {
        PageControlPrivate::updateButtonGeometryForLine(pPVar1,iVar2);
        iVar2 = iVar2 + 1;
      } while (iVar2 < pPVar1->linesCount);
    }
    pPVar1 = (this->d).d;
    iVar2 = pPVar1->count;
    if (iVar2 <= pPVar1->currentIndex) {
      setCurrentIndex(this,iVar2 + -1);
    }
  }
  return;
}

Assistant:

void
PageControl::setCount( int c )
{
	if( d->count != c && c >= 0 )
	{
		d->count = c;

		d->updateButtonsInfo( rect().width() );

		d->rectangles.clear();

		if( d->count > 0 )
		{
			d->rectangles.reserve( d->count );

			d->rectangles.fill( QRect(), d->count );

			d->updateButtonsGeometry();

			if( d->currentIndex >= d->count )
				setCurrentIndex( d->count - 1 );
		}
		else
		{
			const int prev = d->currentIndex;

			d->currentIndex = -1;

			emit currentChanged( d->currentIndex, prev );
		}
	}
}